

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_sse.c
# Opt level: O0

void uavs3d_if_cpy_w4_sse(pel *src,int i_src,pel *dst,int i_dst,int width,int height)

{
  int i_dst4;
  int i_src4;
  int i_dst3;
  int i_src3;
  int i_dst2;
  int i_src2;
  int height_local;
  int width_local;
  int i_dst_local;
  pel *dst_local;
  pel *ppStack_10;
  int i_src_local;
  pel *src_local;
  
  if (height < 4) {
    *(undefined4 *)dst = *(undefined4 *)src;
    *(undefined4 *)(dst + i_dst) = *(undefined4 *)(src + i_src);
  }
  else {
    _width_local = dst;
    ppStack_10 = src;
    for (i_dst2 = height; 0 < i_dst2; i_dst2 = i_dst2 + -4) {
      *(undefined4 *)_width_local = *(undefined4 *)ppStack_10;
      *(undefined4 *)(_width_local + i_dst) = *(undefined4 *)(ppStack_10 + i_src);
      *(undefined4 *)(_width_local + i_dst * 2) = *(undefined4 *)(ppStack_10 + i_src * 2);
      *(undefined4 *)(_width_local + i_dst * 3) = *(undefined4 *)(ppStack_10 + i_src * 3);
      ppStack_10 = ppStack_10 + (i_src << 2);
      _width_local = _width_local + (i_dst << 2);
    }
  }
  return;
}

Assistant:

void uavs3d_if_cpy_w4_sse(const pel *src, int i_src, pel *dst, int i_dst, int width, int height)
{
    if (height < 4) {
        CP32(dst, src);
        CP32(dst + i_dst, src + i_src);
    }
    else {
        int i_src2 = i_src << 1;
        int i_dst2 = i_dst << 1;
        int i_src3 = i_src + i_src2;
        int i_dst3 = i_dst + i_dst2;
        int i_src4 = i_src << 2;
        int i_dst4 = i_dst << 2;
        while (height > 0) {
            CP32(dst, src);
            CP32(dst + i_dst, src + i_src);
            CP32(dst + i_dst2, src + i_src2);
            CP32(dst + i_dst3, src + i_src3);
            height -= 4;
            src += i_src4;
            dst += i_dst4;
        }
    }
}